

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_convex_poly.cpp
# Opt level: O0

bool __thiscall ON_3dSimplex::Closest1plex(ON_3dSimplex *this,ON_4dPoint *Bary)

{
  ON_4dPoint local_c8;
  double local_a8;
  double b0;
  double local_98;
  double local_90;
  double local_88;
  ON_4dPoint local_80;
  ON_3dVector local_60;
  double local_48;
  double dot;
  double Del2;
  ON_3dVector Del;
  bool rc;
  ON_4dPoint *Bary_local;
  ON_3dSimplex *this_local;
  
  Del.z._7_1_ = 0;
  ON_3dVector::operator-((ON_3dVector *)&Del2,this->m_V + 1,this->m_V);
  dot = ON_3dVector::LengthSquared((ON_3dVector *)&Del2);
  if (0.0 < dot) {
    Del.z._7_1_ = 1;
    ON_3dVector::operator-(&local_60,this->m_V);
    local_48 = ON_3dVector::operator*(&local_60,(ON_3dVector *)&Del2);
    if (local_48 < dot) {
      if (0.0 < local_48) {
        local_a8 = 1.0 - (1.0 - local_48 / dot);
        ON_4dPoint::ON_4dPoint(&local_c8,1.0 - local_a8,local_a8,0.0,0.0);
        Bary->x = local_c8.x;
        Bary->y = local_c8.y;
        Bary->z = local_c8.z;
        Bary->w = local_c8.w;
      }
      else {
        ON_4dPoint::ON_4dPoint((ON_4dPoint *)&b0,1.0,0.0,0.0,0.0);
        Bary->x = b0;
        Bary->y = local_98;
        Bary->z = local_90;
        Bary->w = local_88;
      }
    }
    else {
      ON_4dPoint::ON_4dPoint(&local_80,0.0,1.0,0.0,0.0);
      Bary->x = local_80.x;
      Bary->y = local_80.y;
      Bary->z = local_80.z;
      Bary->w = local_80.w;
    }
  }
  return (bool)(Del.z._7_1_ & 1);
}

Assistant:

bool ON_3dSimplex::Closest1plex(ON_4dPoint& Bary) const
{
  bool rc = false;
  ON_3dVector Del = m_V[1] - m_V[0];
  double Del2 = Del.LengthSquared();
  if (Del2 > 0.0)
  {
    rc = true;
    double dot = -m_V[0] * Del;
    if (dot >= Del2)
      Bary = ON_4dPoint(0, 1, 0, 0);
    else if (dot <= 0)
      Bary = ON_4dPoint(1, 0, 0, 0);
    else
    {
      double b0 = dot / Del2;
      b0 = 1 - (1 - b0);      // ensure b0 + ( 1- b0) == 1.0 without rounding 
      Bary = ON_4dPoint(1 - b0, b0, 0, 0);
    }
  }
  return rc;
}